

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::DeadBranchElimPass::Process(DeadBranchElimPass *this)

{
  bool bVar1;
  Op OVar2;
  Status SVar3;
  IRContext *this_00;
  anon_class_8_1_8991fb9c aStack_70;
  bool modified;
  undefined1 local_68 [8];
  ProcessFunction pfn;
  Instruction *ai;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  DeadBranchElimPass *this_local;
  
  Pass::get_module((Pass *)this);
  Module::annotations((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&ai);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&ai);
    if (!bVar1) {
      aStack_70.this = this;
      std::function<bool(spvtools::opt::Function*)>::
      function<spvtools::opt::DeadBranchElimPass::Process()::__0,void>
                ((function<bool(spvtools::opt::Function*)> *)local_68,&stack0xffffffffffffff90);
      this_00 = Pass::context((Pass *)this);
      bVar1 = IRContext::ProcessReachableCallTree(this_00,(ProcessFunction *)local_68);
      if (bVar1) {
        FixBlockOrder(this);
      }
      SVar3 = SuccessWithoutChange;
      if (bVar1) {
        SVar3 = SuccessWithChange;
      }
      std::function<bool_(spvtools::opt::Function_*)>::~function
                ((function<bool_(spvtools::opt::Function_*)> *)local_68);
      return SVar3;
    }
    pfn._M_invoker =
         (_Invoker_type)
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    OVar2 = opt::Instruction::opcode((Instruction *)pfn._M_invoker);
    if (OVar2 == OpGroupDecorate) break;
    InstructionList::iterator::operator++(&__end2);
  }
  return SuccessWithoutChange;
}

Assistant:

Pass::Status DeadBranchElimPass::Process() {
  // Do not process if module contains OpGroupDecorate. Additional
  // support required in KillNamesAndDecorates().
  // TODO(greg-lunarg): Add support for OpGroupDecorate
  for (auto& ai : get_module()->annotations())
    if (ai.opcode() == spv::Op::OpGroupDecorate)
      return Status::SuccessWithoutChange;
  // Process all entry point functions
  ProcessFunction pfn = [this](Function* fp) {
    return EliminateDeadBranches(fp);
  };
  bool modified = context()->ProcessReachableCallTree(pfn);
  if (modified) FixBlockOrder();
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}